

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

VectorXd __thiscall
ChebTools::ChebyshevExpansion::get_node_function_values(ChebyshevExpansion *this)

{
  MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this_00;
  Index extraout_RDX;
  Index extraout_RDX_00;
  Index IVar1;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_RSI;
  VectorXd VVar2;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_20;
  
  if (*(long *)(in_RSI + 0x38) < 1) {
    this_00 = (MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
              UMatrixLibrary::get((UMatrixLibrary *)u_matrix_library,*(long *)(in_RSI + 8) - 1);
    local_20 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*(this_00,in_RSI);
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)&local_20);
    IVar1 = extraout_RDX_00;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)this,
               (DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)(in_RSI + 0x30));
    IVar1 = extraout_RDX;
  }
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = IVar1;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd ChebyshevExpansion::get_node_function_values() const{
        if (m_nodal_value_cache.size() > 0) {
            return m_nodal_value_cache;
        }
        else {
            std::size_t N = m_c.size() - 1;
            return u_matrix_library.get(N) * m_c;
        }
    }